

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O1

int ncnn::reduction_post_process<ncnn::post_process_log<float>>(Mat *a,float coeff,Option *opt)

{
  int iVar1;
  uint uVar2;
  uint extraout_EAX;
  uint extraout_EAX_00;
  uint uVar3;
  uint extraout_EAX_01;
  long lVar4;
  long extraout_RAX;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  void *pvVar9;
  float fVar10;
  
  iVar1 = a->dims;
  if (iVar1 == 2) {
    uVar3 = a->h * a->w;
    if (0 < (int)uVar3) {
      pvVar9 = a->data;
      uVar8 = (ulong)uVar3;
      uVar6 = 0;
      do {
        fVar10 = logf(*(float *)((long)pvVar9 + uVar6 * 4));
        *(float *)((long)pvVar9 + uVar6 * 4) = fVar10;
        uVar6 = uVar6 + 1;
        uVar3 = extraout_EAX_00;
      } while (uVar8 != uVar6);
    }
  }
  else if (iVar1 == 1) {
    iVar1 = a->w;
    uVar3 = 1;
    if (0 < (long)iVar1) {
      pvVar9 = a->data;
      lVar7 = 0;
      do {
        fVar10 = logf(*(float *)((long)pvVar9 + lVar7 * 4));
        *(float *)((long)pvVar9 + lVar7 * 4) = fVar10;
        lVar7 = lVar7 + 1;
        uVar3 = extraout_EAX;
      } while (iVar1 != lVar7);
    }
  }
  else {
    uVar3 = iVar1 - 3;
    if (uVar3 < 2) {
      uVar2 = a->c;
      uVar5 = a->h * a->w * a->d;
      if ((ulong)uVar2 == 1) {
        if (0 < (int)uVar5) {
          pvVar9 = a->data;
          uVar8 = 0;
          do {
            fVar10 = logf(*(float *)((long)pvVar9 + uVar8 * 4));
            *(float *)((long)pvVar9 + uVar8 * 4) = fVar10;
            uVar8 = uVar8 + 1;
            uVar3 = extraout_EAX_01;
          } while (uVar5 != uVar8);
        }
      }
      else if (0 < (int)uVar2) {
        pvVar9 = a->data;
        lVar4 = a->cstep * a->elemsize;
        uVar8 = 0;
        lVar7 = lVar4;
        do {
          if (0 < (int)uVar5) {
            uVar6 = 0;
            do {
              fVar10 = logf(*(float *)((long)pvVar9 + uVar6 * 4));
              *(float *)((long)pvVar9 + uVar6 * 4) = fVar10;
              uVar6 = uVar6 + 1;
              lVar7 = extraout_RAX;
            } while (uVar5 != uVar6);
          }
          uVar3 = (uint)lVar7;
          uVar8 = uVar8 + 1;
          pvVar9 = (void *)((long)pvVar9 + lVar4);
        } while (uVar8 != uVar2);
      }
    }
  }
  return uVar3;
}

Assistant:

static int reduction_post_process(Mat& a, float coeff, const Option& opt)
{
    MathOp mathop;

    int dims = a.dims;
    if (dims == 1)
    {
        int w = a.w;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < w; i++)
            a[i] = mathop(a[i]) * coeff;
    }
    else if (dims == 2)
    {
        int size = a.w * a.h;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < size; i++)
            a[i] = mathop(a[i]) * coeff;
    }
    else if (dims == 3 || dims == 4)
    {
        int c = a.c;
        int size = a.w * a.h * a.d;
        if (c == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < size; i++)
                a[i] = mathop(a[i]) * coeff;
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < c; q++)
            {
                float* outptr = a.channel(q);
                for (int i = 0; i < size; i++)
                    outptr[i] = mathop(outptr[i]) * coeff;
            }
        }
    }

    return 0;
}